

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O1

DeclaredType * __thiscall slang::ast::Symbol::getDeclaredType(Symbol *this)

{
  SymbolKind kind;
  bool bVar1;
  DeclaredType *pDVar2;
  
  kind = this->kind;
  if ((int)kind < 0x44) {
    if ((int)kind < 0x28) {
      if (kind == TypeAlias) {
        return (DeclaredType *)&this[1].name;
      }
      if (kind == NetType) {
LAB_003523f5:
        return (DeclaredType *)(this + 1);
      }
    }
    else {
      if (kind == TypeParameter) {
        return (DeclaredType *)&this[1].location;
      }
      if (kind == Subroutine) goto LAB_00352411;
    }
  }
  else if ((int)kind < 0x59) {
    if (kind == MethodPrototype) {
LAB_00352411:
      return (DeclaredType *)&this[1].originatingSyntax;
    }
    if (kind == AssertionPort) goto LAB_003523f5;
  }
  else if ((kind == RandSeqProduction) || (kind == Coverpoint)) goto LAB_00352411;
  bVar1 = ValueSymbol::isKind(kind);
  pDVar2 = (DeclaredType *)0x0;
  if (bVar1) {
    pDVar2 = (DeclaredType *)(this + 1);
  }
  return pDVar2;
}

Assistant:

const DeclaredType* Symbol::getDeclaredType() const {
    switch (kind) {
        case SymbolKind::TypeAlias:
            return &as<TypeAliasType>().targetType;
        case SymbolKind::Subroutine:
            return &as<SubroutineSymbol>().declaredReturnType;
        case SymbolKind::MethodPrototype:
            return &as<MethodPrototypeSymbol>().declaredReturnType;
        case SymbolKind::NetType:
            return &as<NetType>().declaredType;
        case SymbolKind::TypeParameter:
            return &as<TypeParameterSymbol>().targetType;
        case SymbolKind::AssertionPort:
            return &as<AssertionPortSymbol>().declaredType;
        case SymbolKind::RandSeqProduction:
            return &as<RandSeqProductionSymbol>().declaredReturnType;
        case SymbolKind::Coverpoint:
            return &as<CoverpointSymbol>().declaredType;
        default:
            if (isValue())
                return as<ValueSymbol>().getDeclaredType();
            return nullptr;
    }
}